

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 sqlite3GetVarint32(uchar *p,u32 *v)

{
  uint *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  u8 n;
  u64 v64;
  u8 local_11;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if ((in_RDI[1] & 0x80) == 0) {
    *in_RSI = (*in_RDI & 0x7f) << 7 | (uint)in_RDI[1];
    local_11 = '\x02';
  }
  else if ((in_RDI[2] & 0x80) == 0) {
    *in_RSI = (*in_RDI & 0x7f) << 0xe | (in_RDI[1] & 0x7f) << 7 | (uint)in_RDI[2];
    local_11 = '\x03';
  }
  else {
    local_11 = sqlite3GetVarint(in_RDI,(u64 *)&local_10);
    if ((undefined1 *)((ulong)local_10 & 0xffffffff) == local_10) {
      *in_RSI = (uint)local_10;
    }
    else {
      *in_RSI = 0xffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

SQLITE_PRIVATE u8 sqlite3GetVarint32(const unsigned char *p, u32 *v){
  u64 v64;
  u8 n;

  /* Assume that the single-byte case has already been handled by
  ** the getVarint32() macro */
  assert( (p[0] & 0x80)!=0 );

  if( (p[1] & 0x80)==0 ){
    /* This is the two-byte case */
    *v = ((p[0]&0x7f)<<7) | p[1];
    return 2;
  }
  if( (p[2] & 0x80)==0 ){
    /* This is the three-byte case */
    *v = ((p[0]&0x7f)<<14) | ((p[1]&0x7f)<<7) | p[2];
    return 3;
  }
  /* four or more bytes */
  n = sqlite3GetVarint(p, &v64);
  assert( n>3 && n<=9 );
  if( (v64 & SQLITE_MAX_U32)!=v64 ){
    *v = 0xffffffff;
  }else{
    *v = (u32)v64;
  }
  return n;
}